

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O3

void __thiscall cmCTestBZR::LogParser::EndElement(LogParser *this,string *name)

{
  bool bVar1;
  int iVar2;
  pointer pcVar3;
  char *pcVar4;
  Revision *pRVar5;
  string *psVar6;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28;
  undefined7 uStack_27;
  
  iVar2 = std::__cxx11::string::compare((char *)name);
  if (iVar2 == 0) {
    (*(this->BZR->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[8])
              (this->BZR,&this->Rev,&this->Changes);
    goto LAB_0030bf77;
  }
  if ((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish) goto LAB_0030bf77;
  iVar2 = std::__cxx11::string::compare((char *)name);
  if (iVar2 == 0) {
LAB_0030bf30:
    pcVar4 = (char *)(this->CurChange).Path._M_string_length;
    pcVar3 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)name);
    if (iVar2 == 0) goto LAB_0030bf30;
    if ((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_0030bf77;
    iVar2 = std::__cxx11::string::compare((char *)name);
    pcVar3 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar2 != 0) {
      if (pcVar3 != (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        iVar2 = std::__cxx11::string::compare((char *)name);
        pcVar3 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (iVar2 == 0) {
          psVar6 = &(this->Rev).Author;
          std::__cxx11::string::_M_replace
                    ((ulong)psVar6,0,(char *)(this->Rev).Author._M_string_length,(ulong)pcVar3);
          bVar1 = cmsys::RegularExpression::find
                            (&this->EmailRegex,(this->Rev).Author._M_dataplus._M_p);
          if (bVar1) {
            pcVar4 = (this->EmailRegex).startp[1];
            if (pcVar4 == (char *)0x0) {
              local_38 = &local_28;
              local_30 = 0;
              local_28 = 0;
            }
            else {
              local_38 = &local_28;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_38,pcVar4,(this->EmailRegex).endp[1]);
            }
            std::__cxx11::string::operator=((string *)psVar6,(string *)&local_38);
            if (local_38 != &local_28) {
              operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
            }
            pcVar4 = (this->EmailRegex).startp[2];
            local_38 = &local_28;
            if (pcVar4 == (char *)0x0) {
              local_30 = 0;
              local_28 = 0;
            }
            else {
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_38,pcVar4,(this->EmailRegex).endp[2]);
            }
            std::__cxx11::string::operator=((string *)&(this->Rev).EMail,(string *)&local_38);
            if (local_38 != &local_28) {
              operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
            }
          }
        }
        else if (pcVar3 != (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish) {
          iVar2 = std::__cxx11::string::compare((char *)name);
          pcVar3 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (iVar2 == 0) {
            pRVar5 = (Revision *)&(this->Rev).Date;
            pcVar4 = (char *)(this->Rev).Date._M_string_length;
          }
          else {
            if (pcVar3 == (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish) goto LAB_0030bf77;
            iVar2 = std::__cxx11::string::compare((char *)name);
            pcVar3 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (iVar2 == 0) {
              pRVar5 = (Revision *)&(this->Rev).Log;
              pcVar4 = (char *)(this->Rev).Log._M_string_length;
            }
            else {
              if (pcVar3 == (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish) goto LAB_0030bf77;
              iVar2 = std::__cxx11::string::compare((char *)name);
              if (iVar2 != 0) goto LAB_0030bf77;
              pRVar5 = &this->Rev;
              pcVar4 = (char *)(this->Rev).Rev._M_string_length;
              pcVar3 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
            }
          }
          std::__cxx11::string::_M_replace((ulong)pRVar5,0,pcVar4,(ulong)pcVar3);
        }
      }
      goto LAB_0030bf77;
    }
    pcVar4 = (char *)(this->CurChange).Path._M_string_length;
  }
  psVar6 = &(this->CurChange).Path;
  std::__cxx11::string::_M_replace((ulong)psVar6,0,pcVar4,(ulong)pcVar3);
  cmsys::SystemTools::ConvertToUnixSlashes(psVar6);
  std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::push_back
            (&this->Changes,&this->CurChange);
LAB_0030bf77:
  pcVar3 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish != pcVar3) {
    (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar3;
  }
  return;
}

Assistant:

void EndElement(const std::string& name) CM_OVERRIDE
  {
    if (name == "log") {
      this->BZR->DoRevision(this->Rev, this->Changes);
    } else if (!this->CData.empty() &&
               (name == "file" || name == "directory")) {
      this->CurChange.Path.assign(&this->CData[0], this->CData.size());
      cmSystemTools::ConvertToUnixSlashes(this->CurChange.Path);
      this->Changes.push_back(this->CurChange);
    } else if (!this->CData.empty() && name == "symlink") {
      // symlinks have an arobase at the end in the log
      this->CurChange.Path.assign(&this->CData[0], this->CData.size() - 1);
      cmSystemTools::ConvertToUnixSlashes(this->CurChange.Path);
      this->Changes.push_back(this->CurChange);
    } else if (!this->CData.empty() && name == "committer") {
      this->Rev.Author.assign(&this->CData[0], this->CData.size());
      if (this->EmailRegex.find(this->Rev.Author)) {
        this->Rev.Author = this->EmailRegex.match(1);
        this->Rev.EMail = this->EmailRegex.match(2);
      }
    } else if (!this->CData.empty() && name == "timestamp") {
      this->Rev.Date.assign(&this->CData[0], this->CData.size());
    } else if (!this->CData.empty() && name == "message") {
      this->Rev.Log.assign(&this->CData[0], this->CData.size());
    } else if (!this->CData.empty() && name == "revno") {
      this->Rev.Rev.assign(&this->CData[0], this->CData.size());
    }
    this->CData.clear();
  }